

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask5_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 5 | *out;
  *out = in[2] << 10 | *out;
  *out = in[3] << 0xf | *out;
  *out = in[4] << 0x14 | *out;
  *out = in[5] << 0x19 | *out;
  *out = in[6] << 0x1e | *out;
  puVar1 = out + 1;
  *puVar1 = in[6] >> 2;
  *puVar1 = in[7] << 3 | *puVar1;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask5_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (5 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;

  return out + 1;
}